

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

ON_wString Internal_VulgarFractionXator(int updown,ON_wString *X)

{
  int iVar1;
  int iVar2;
  wchar_t *pwVar3;
  ON_wString *in_RDX;
  undefined4 in_register_0000003c;
  ON_wString *this;
  ON_wString *local_b8;
  ON__UINT32 local_ac;
  ON__UINT32 local_a8;
  uint local_a0;
  ON_wString local_70;
  ON__UINT32 local_68;
  ON__UINT32 local_64;
  ON__UINT32 cp1;
  ON__UINT32 cp0;
  int i;
  int delta;
  ON_UnicodeErrorParameters e;
  ON_wString local_40;
  ON_wString ator;
  bool bReturnAtor;
  wchar_t *s0;
  int len;
  ON_wString *X_local;
  int updown_local;
  
  this = (ON_wString *)CONCAT44(in_register_0000003c,updown);
  if ((int)X == 0) {
    ON_wString::ON_wString(this,in_RDX);
  }
  else {
    iVar1 = ON_wString::Length(in_RDX);
    if (iVar1 < 1) {
      ON_wString::ON_wString(this,&ON_wString::EmptyString);
    }
    else {
      pwVar3 = ON_wString::Array(in_RDX);
      if (pwVar3 == (wchar_t *)0x0) {
        ON_wString::ON_wString(this,&ON_wString::EmptyString);
      }
      else {
        ator.m_s._7_1_ = 0;
        ON_wString::ON_wString(&local_40);
        ON_wString::ReserveArray(&local_40,(long)iVar1);
        cp0 = 0;
        for (cp1 = 0; (int)cp1 < iVar1; cp1 = local_ac + cp1) {
          e.m_error_status = ON_UnicodeErrorParameters::MaskErrors.m_error_code_point;
          i = ON_UnicodeErrorParameters::MaskErrors.m_error_status;
          delta = ON_UnicodeErrorParameters::MaskErrors.m_error_mask;
          local_64 = 0x110000;
          cp0 = ON_DecodeWideChar(pwVar3 + (int)cp1,iVar1 - cp1,(ON_UnicodeErrorParameters *)&i,
                                  &local_64);
          if (((int)cp0 < 1) || (iVar2 = ON_IsValidUnicodeCodePoint(local_64), iVar2 == 0)) {
            local_a8 = 0xfffd;
          }
          else {
            if ((int)X < 1) {
              local_a0 = ON_UnicodeSubcriptFromCodePoint(local_64,local_64);
            }
            else {
              local_a0 = ON_UnicodeSuperscriptFromCodePoint(local_64,local_64);
            }
            local_a8 = local_a0;
          }
          local_68 = local_a8;
          if ((local_a8 != local_64) && (local_a8 != 0xfffd)) {
            ator.m_s._7_1_ = 1;
          }
          ON_wString::FromUnicodeCodePoint(&local_70,local_a8);
          ON_wString::operator+=(&local_40,&local_70);
          ON_wString::~ON_wString(&local_70);
          if ((int)cp0 < 1) {
            local_ac = 1;
          }
          else {
            local_ac = cp0;
          }
        }
        local_b8 = in_RDX;
        if ((ator.m_s._7_1_ & 1) != 0) {
          local_b8 = &local_40;
        }
        ON_wString::ON_wString(this,local_b8);
        ON_wString::~ON_wString(&local_40);
      }
    }
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

static const ON_wString Internal_VulgarFractionXator(int updown, const ON_wString X)
{
  if (0 == updown)
    return X;

  const int len = X.Length();
  if (len <= 0)
    return ON_wString::EmptyString;
  const wchar_t* s0 = X.Array();
  if (nullptr == s0)
    return ON_wString::EmptyString;


  bool bReturnAtor = false;
  ON_wString ator;
  ator.ReserveArray(len);
  ON_UnicodeErrorParameters e;
  int delta = 0;
  for (int i = 0; i < len; i += ((delta > 0) ? delta : 1))
  {
    e = ON_UnicodeErrorParameters::MaskErrors;
    ON__UINT32 cp0 = ON_UnicodeCodePoint::ON_InvalidCodePoint;
    delta = ON_DecodeWideChar(s0 + i, len - i, &e, &cp0);
    ON__UINT32 cp1
      = (delta > 0 && ON_IsValidUnicodeCodePoint(cp0))
      ? (updown > 0 ? ON_UnicodeSuperscriptFromCodePoint(cp0,cp0) : ON_UnicodeSubcriptFromCodePoint(cp0,cp0))
      : ON_UnicodeCodePoint::ON_ReplacementCharacter;
    if (cp1 != cp0 && cp1 != ON_UnicodeCodePoint::ON_ReplacementCharacter)
      bReturnAtor = true;
    ator += ON_wString::FromUnicodeCodePoint(cp1);
  }

  return bReturnAtor ? ator : X;
}